

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O1

int __thiscall luna::Lexer::LexMultiLineString(Lexer *this,TokenDetail *detail)

{
  string *str;
  int iVar1;
  String *pSVar2;
  LexException *this_00;
  uint uVar3;
  anon_union_16_2_eed97686_for_String_2 *paVar4;
  char cVar5;
  uint uVar6;
  
  uVar3 = 0;
  while (this->current_ == 0x3d) {
    uVar3 = uVar3 + 1;
    iVar1 = Next(this);
    this->current_ = iVar1;
  }
  if (this->current_ != 0x5b) {
    this_00 = (LexException *)__cxa_allocate_exception(0x20);
    pSVar2 = this->module_;
    if ((pSVar2->super_GCObject).field_0x11 == '\0') {
      paVar4 = &pSVar2->field_1;
    }
    else {
      paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
    }
    LexException::LexException<char_const(&)[34],std::__cxx11::string&,char_const(&)[2]>
              (this_00,paVar4->str_buffer_,this->line_,this->column_,
               (char (*) [34])"incomplete multi-line string at \'",&this->token_buffer_,
               (char (*) [2])0x143e83);
LAB_0013be6a:
    __cxa_throw(this_00,&LexException::typeinfo,Exception::~Exception);
  }
  iVar1 = Next(this);
  this->current_ = iVar1;
  str = &this->token_buffer_;
  (this->token_buffer_)._M_string_length = 0;
  *(this->token_buffer_)._M_dataplus._M_p = '\0';
  cVar5 = (char)str;
  if ((this->current_ != 0xd) && (this->current_ != 10)) goto LAB_0013be8d;
  LexNewLine(this);
  if (uVar3 != 0) goto LAB_0013be8d;
  do {
    std::__cxx11::string::push_back(cVar5);
LAB_0013be8d:
    while (iVar1 = this->current_, 0xc < iVar1) {
      if (iVar1 == 0xd) goto LAB_0013bf3a;
      if (iVar1 != 0x5d) goto LAB_0013beea;
      iVar1 = Next(this);
      this->current_ = iVar1;
      if (iVar1 == 0x3d && uVar3 != 0) {
        uVar6 = 0;
        do {
          uVar6 = uVar6 + 1;
          iVar1 = Next(this);
          this->current_ = iVar1;
          if (iVar1 != 0x3d) break;
        } while (uVar6 < uVar3);
      }
      else {
        uVar6 = 0;
      }
      if (iVar1 == 0x5d && uVar6 == uVar3) {
        iVar1 = Next(this);
        this->current_ = iVar1;
        pSVar2 = State::GetString(this->state_,str);
        (detail->field_0).str_ = pSVar2;
        detail->token_ = 0x116;
        iVar1 = this->column_;
        detail->line_ = this->line_;
        detail->column_ = iVar1;
        detail->module_ = this->module_;
        return 0x116;
      }
      std::__cxx11::string::push_back(cVar5);
      std::__cxx11::string::_M_replace_aux
                ((ulong)str,(this->token_buffer_)._M_string_length,0,(char)uVar6);
    }
    if (iVar1 != 10) {
      if (iVar1 == -1) {
        this_00 = (LexException *)__cxa_allocate_exception(0x20);
        pSVar2 = this->module_;
        if ((pSVar2->super_GCObject).field_0x11 == '\0') {
          paVar4 = &pSVar2->field_1;
        }
        else {
          paVar4 = (anon_union_16_2_eed97686_for_String_2 *)(pSVar2->field_1).str_;
        }
        LexException::LexException<char_const(&)[38]>
                  (this_00,paVar4->str_buffer_,this->line_,this->column_,
                   (char (*) [38])"incomplete multi-line string at <eof>");
        goto LAB_0013be6a;
      }
LAB_0013beea:
      std::__cxx11::string::push_back(cVar5);
      iVar1 = Next(this);
      this->current_ = iVar1;
      goto LAB_0013be8d;
    }
LAB_0013bf3a:
    LexNewLine(this);
  } while( true );
}

Assistant:

int Lexer::LexMultiLineString(TokenDetail *detail)
    {
        int equals = 0;
        while (current_ == '=')
        {
            ++equals;
            current_ = Next();
        }

        if (current_ != '[')
            throw LexException(module_->GetCStr(), line_, column_,
                    "incomplete multi-line string at '", token_buffer_, "'");

        current_ = Next();
        token_buffer_.clear();

        if (current_ == '\r' || current_ == '\n')
        {
            LexNewLine();
            if (equals == 0)    // "[[]]" keeps first '\n'
                token_buffer_.push_back('\n');
        }

        while (current_ != EOF)
        {
            if (current_ == ']')
            {
                current_ = Next();
                int i = 0;
                for (; i < equals; ++i, current_ = Next())
                {
                    if (current_ != '=')
                        break;
                }

                if (i == equals && current_ == ']')
                {
                    current_ = Next();
                    RETURN_TOKEN_DETAIL(detail, token_buffer_, Token_String);
                }
                else
                {
                    token_buffer_.push_back(']');
                    token_buffer_.append(i, '=');
                }
            }
            else if (current_ == '\r' || current_ == '\n')
            {
                LexNewLine();
                token_buffer_.push_back('\n');
            }
            else
            {
                token_buffer_.push_back(current_);
                current_ = Next();
            }
        }

        throw LexException(module_->GetCStr(), line_, column_,
                "incomplete multi-line string at <eof>");
    }